

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *window)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImVec2 *ref_pos_00;
  ImGuiPopupPositionPolicy policy;
  float fVar5;
  float fVar6;
  float local_68;
  float fStack_64;
  ImRect r_outer;
  ImRect local_48;
  ImVec2 ref_pos;
  
  pIVar4 = GImGui;
  uVar1 = window->Flags;
  if ((uVar1 >> 0x1c & 1) == 0) {
    if ((uVar1 >> 0x1a & 1) == 0) {
      if ((uVar1 >> 0x19 & 1) == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x22cc,"ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *)");
      }
      fVar5 = (GImGui->Style).MouseCursorScale;
      IVar3 = NavCalcPreferredRefPos();
      ref_pos = IVar3;
      r_outer = GetWindowAllowedExtentRect(window);
      if (((pIVar4->NavDisableHighlight == false) && (pIVar4->NavDisableMouseHover == true)) &&
         (((pIVar4->IO).ConfigFlags & 4) == 0)) {
        fVar5 = 16.0;
        fVar6 = 8.0;
      }
      else {
        fVar5 = fVar5 * 24.0;
        fVar6 = fVar5;
      }
      local_68 = IVar3.x;
      fStack_64 = IVar3.y;
      local_48.Min.y = fStack_64 + -8.0;
      local_48.Min.x = local_68 + -16.0;
      local_48.Max.y = fVar6 + fStack_64;
      local_48.Max.x = fVar5 + local_68;
      ref_pos_00 = &ref_pos;
      policy = ImGuiPopupPositionPolicy_Tooltip;
      goto LAB_0012bd3c;
    }
    r_outer = GetWindowAllowedExtentRect(window);
    fVar5 = (window->Pos).x;
    fVar6 = (window->Pos).y;
    local_48.Min.y = fVar6 + -1.0;
    local_48.Min.x = fVar5 + -1.0;
    local_48.Max.y = fVar6 + 1.0;
    local_48.Max.x = fVar5 + 1.0;
  }
  else {
    pIVar2 = window->ParentWindow;
    fVar5 = (GImGui->Style).ItemInnerSpacing.x;
    r_outer = GetWindowAllowedExtentRect(window);
    if ((pIVar2->DC).MenuBarAppending == true) {
      local_48.Min.y = (pIVar2->ClipRect).Min.y;
      local_48.Max.y = (pIVar2->ClipRect).Max.y;
      local_48.Max.x = 3.4028235e+38;
      local_48.Min.x = -3.4028235e+38;
    }
    else {
      fVar6 = (pIVar2->Pos).x;
      local_48.Min.x = fVar5 + fVar6;
      local_48.Max.x = ((fVar6 + (pIVar2->Size).x) - fVar5) - (pIVar2->ScrollbarSizes).x;
      local_48.Max.y = 3.4028235e+38;
      local_48.Min.y = -3.4028235e+38;
    }
  }
  ref_pos_00 = &window->Pos;
  policy = ImGuiPopupPositionPolicy_Default;
LAB_0012bd3c:
  IVar3 = FindBestWindowPosForPopupEx
                    (ref_pos_00,&window->Size,&window->AutoPosLastDirection,&r_outer,&local_48,
                     policy);
  return IVar3;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
    {
        // Child menus typically request _any_ position within the parent menu item, and then we move the new menu outside the parent bounds.
        // This is how we end up with child menus appearing (most-commonly) on the right of the parent menu.
        ImGuiWindow* parent_window = window->ParentWindow;
        float horizontal_overlap = g.Style.ItemInnerSpacing.x; // We want some overlap to convey the relative depth of each menu (currently the amount of overlap is hard-coded to style.ItemSpacing.x).
        ImRect r_outer = GetWindowAllowedExtentRect(window);
        ImRect r_avoid;
        if (parent_window->DC.MenuBarAppending)
            r_avoid = ImRect(-FLT_MAX, parent_window->ClipRect.Min.y, FLT_MAX, parent_window->ClipRect.Max.y); // Avoid parent menu-bar. If we wanted multi-line menu-bar, we may instead want to have the calling window setup e.g. a NextWindowData.PosConstraintAvoidRect field
        else
            r_avoid = ImRect(parent_window->Pos.x + horizontal_overlap, -FLT_MAX, parent_window->Pos.x + parent_window->Size.x - horizontal_overlap - parent_window->ScrollbarSizes.x, FLT_MAX);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Default);
    }
    if (window->Flags & ImGuiWindowFlags_Popup)
    {
        ImRect r_outer = GetWindowAllowedExtentRect(window);
        ImRect r_avoid = ImRect(window->Pos.x - 1, window->Pos.y - 1, window->Pos.x + 1, window->Pos.y + 1);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Default);
    }
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Position tooltip (always follows mouse)
        float sc = g.Style.MouseCursorScale;
        ImVec2 ref_pos = NavCalcPreferredRefPos();
        ImRect r_outer = GetWindowAllowedExtentRect(window);
        ImRect r_avoid;
        if (!g.NavDisableHighlight && g.NavDisableMouseHover && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos))
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 16, ref_pos.y + 8);
        else
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 24 * sc, ref_pos.y + 24 * sc); // FIXME: Hard-coded based on mouse cursor shape expectation. Exact dimension not very important.
        return FindBestWindowPosForPopupEx(ref_pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid, ImGuiPopupPositionPolicy_Tooltip);
    }
    IM_ASSERT(0);
    return window->Pos;
}